

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  float fVar1;
  int iVar2;
  Layer *pLVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  Mat weight_data_n;
  Mat int8_weight_data;
  Mat int8_weight_data_n;
  Option opt_q;
  ParamDict pd;
  
  sVar6 = (this->weight_data).elemsize;
  if (sVar6 == 1) {
    bVar8 = true;
    if ((opt->use_int8_inference & 1U) == 0) {
      fwrite("quantized int8 weight loaded but use_int8_inference disabled\n",0x3d,1,_stderr);
      return -1;
    }
  }
  else if ((~opt->use_int8_inference & 1U) == 0 && sVar6 == 4) {
    bVar8 = this->int8_scale_term != 0;
  }
  else {
    bVar8 = false;
  }
  this->use_int8_inference = bVar8;
  if ((~bVar8 & 1U) == 0 && sVar6 == 4) {
    Mat::Mat(&int8_weight_data,this->weight_data_size,1,(Allocator *)0x0);
    if ((int8_weight_data.data == (void *)0x0) ||
       ((long)int8_weight_data.c * int8_weight_data.cstep == 0)) {
      Mat::~Mat(&int8_weight_data);
      return -100;
    }
    iVar4 = this->num_output;
    iVar2 = this->weight_data_size / iVar4;
    sVar6 = (size_t)iVar2;
    lVar5 = 0;
    for (lVar7 = 0; lVar7 < iVar4; lVar7 = lVar7 + 1) {
      pLVar3 = create_layer(0x39);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,*(float *)((long)(this->weight_data_int8_scales).data + lVar7 * 4));
      (*pLVar3->_vptr_Layer[2])(pLVar3,&pd);
      (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
      opt_q.lightmode = opt->lightmode;
      opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_q.num_threads = opt->num_threads;
      opt_q.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
      opt_q.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
      opt_q.use_winograd_convolution = opt->use_winograd_convolution;
      opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_q.use_int8_inference = opt->use_int8_inference;
      opt_q.use_vulkan_compute = opt->use_vulkan_compute;
      opt_q.use_fp16_packed = opt->use_fp16_packed;
      opt_q.use_fp16_storage = opt->use_fp16_storage;
      opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_q.use_int8_storage = opt->use_int8_storage;
      opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_q.use_packing_layout = opt->use_packing_layout;
      opt_q._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_q.blob_allocator = int8_weight_data.allocator;
      weight_data_n.elemsize = (this->weight_data).elemsize;
      weight_data_n.data = (void *)(weight_data_n.elemsize * lVar5 + (long)(this->weight_data).data)
      ;
      weight_data_n.elempack = (this->weight_data).elempack;
      weight_data_n.allocator = (this->weight_data).allocator;
      weight_data_n.refcount = (int *)0x0;
      int8_weight_data_n.dims = 1;
      weight_data_n.w = iVar2;
      weight_data_n.dims = 1;
      weight_data_n.h = 1;
      weight_data_n.c = 1;
      int8_weight_data_n.data =
           (void *)(CONCAT44(int8_weight_data.elemsize._4_4_,(undefined4)int8_weight_data.elemsize)
                    * lVar5 + (long)int8_weight_data.data);
      int8_weight_data_n.refcount = (int *)0x0;
      int8_weight_data_n.elempack = int8_weight_data.elempack;
      int8_weight_data_n.allocator = int8_weight_data.allocator;
      int8_weight_data_n.h = 1;
      int8_weight_data_n.c = 1;
      weight_data_n.cstep = sVar6;
      int8_weight_data_n.w = iVar2;
      int8_weight_data_n.cstep = sVar6;
      (*pLVar3->_vptr_Layer[7])(pLVar3,&weight_data_n,&int8_weight_data_n,&opt_q);
      (*pLVar3->_vptr_Layer[1])(pLVar3);
      Mat::~Mat(&int8_weight_data_n);
      Mat::~Mat(&weight_data_n);
      ParamDict::~ParamDict(&pd);
      iVar4 = this->num_output;
      lVar5 = lVar5 + sVar6;
    }
    Mat::operator=(&this->weight_data,&int8_weight_data);
    Mat::~Mat(&int8_weight_data);
    bVar8 = (bool)(this->use_int8_inference & 1);
  }
  if (bVar8 != false) {
    pLVar3 = create_layer(0x39);
    this->quantize = pLVar3;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->bottom_blob_int8_scale);
    (*this->quantize->_vptr_Layer[2])(this->quantize,&pd);
    (*this->quantize->_vptr_Layer[4])(this->quantize,opt);
    ParamDict::~ParamDict(&pd);
    this_00 = &this->dequantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (this_00,(long)this->num_output);
    for (lVar5 = 0; lVar5 < this->num_output; lVar5 = lVar5 + 1) {
      pLVar3 = create_layer(0x3a);
      (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar5] = pLVar3;
      fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar5 * 4);
      int8_weight_data_n.data =
           (void *)CONCAT44((int)((ulong)int8_weight_data_n.data >> 0x20),
                            ~-(uint)(fVar1 == 0.0) &
                            (uint)(1.0 / (this->bottom_blob_int8_scale * fVar1)));
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,int8_weight_data_n.data._0_4_);
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,1);
      pLVar3 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar5];
      (*pLVar3->_vptr_Layer[2])(pLVar3,&pd);
      pLVar3 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar5];
      (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
      int8_weight_data.elemsize._0_4_ = 0;
      int8_weight_data.elemsize._4_4_ = 0;
      int8_weight_data.elempack = 0;
      int8_weight_data.data = (void *)0x0;
      int8_weight_data.refcount._0_4_ = 0;
      int8_weight_data.refcount._4_4_ = 0;
      int8_weight_data.h = 0;
      int8_weight_data.c = 0;
      int8_weight_data.cstep = 0;
      int8_weight_data.allocator = (Allocator *)0x0;
      int8_weight_data.dims = 0;
      int8_weight_data.w = 0;
      weight_data_n.elemsize = (this->bias_data).elemsize;
      weight_data_n.data = (void *)(weight_data_n.elemsize * lVar5 + (long)(this->bias_data).data);
      weight_data_n.elempack = (this->bias_data).elempack;
      weight_data_n.allocator = (this->bias_data).allocator;
      weight_data_n.refcount = (int *)0x0;
      weight_data_n.dims = 1;
      weight_data_n.w = 1;
      weight_data_n.h = 1;
      weight_data_n.c = 1;
      weight_data_n.cstep = 1;
      Mat::operator=(&int8_weight_data,&weight_data_n);
      Mat::~Mat(&weight_data_n);
      pLVar3 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar5];
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)&weight_data_n,&int8_weight_data);
      (*pLVar3->_vptr_Layer[3])(pLVar3,&weight_data_n);
      ModelBin::~ModelBin((ModelBin *)&weight_data_n);
      std::vector<float,_std::allocator<float>_>::push_back
                (&this->dequantize_scales,(value_type_conflict1 *)&int8_weight_data_n);
      Mat::~Mat(&int8_weight_data);
      ParamDict::~ParamDict(&pd);
    }
  }
  return 0;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            dequantize_ops[n]->create_pipeline(opt);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}